

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog.cpp
# Opt level: O0

void __thiscall Dialog::AddLink(Dialog *this,int id,string *text)

{
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string *local_20;
  string *text_local;
  Dialog *pDStack_10;
  int id_local;
  Dialog *this_local;
  
  local_20 = text;
  text_local._4_4_ = id;
  pDStack_10 = this;
  std::make_pair<int&,std::__cxx11::string_const&>(&local_48,(int *)((long)&text_local + 4),text);
  std::
  multimap<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::insert<std::pair<int,std::__cxx11::string>>
            ((multimap<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
              *)&this->links,&local_48);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair(&local_48);
  return;
}

Assistant:

void Dialog::AddLink(int id, const std::string& text)
{
	this->links.insert(std::make_pair(id, text));
}